

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O3

void __thiscall
amrex::FaceLinear::interp_face
          (FaceLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,int ncomp,
          Box *fine_region,IntVect *ratio,IArrayBox *solve_mask,Geometry *param_9,Geometry *param_10
          ,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  double *pdVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  double *pdVar35;
  uint uVar36;
  bool bVar37;
  double dVar38;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_19c;
  double *local_190;
  ulong local_180;
  ulong local_158;
  int local_14c;
  int local_148;
  int local_144;
  double *local_f8;
  long local_98;
  long local_90;
  long local_88;
  ulong local_68;
  
  pdVar28 = (fine->super_BaseFab<double>).dptr;
  iVar1 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
  lVar17 = (long)iVar1;
  iVar2 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
  lVar34 = (long)iVar2;
  iVar3 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  lVar32 = (long)iVar3;
  lVar30 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
  lVar22 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
  lVar23 = lVar22 * lVar30;
  lVar13 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1);
  lVar20 = lVar23 * lVar13;
  lVar24 = (long)fine_comp;
  lVar26 = lVar20 * lVar24;
  iVar19 = (crse->super_BaseFab<double>).domain.smallend.vect[0];
  lVar21 = (long)(((crse->super_BaseFab<double>).domain.bigend.vect[0] - iVar19) + 1);
  iVar18 = (crse->super_BaseFab<double>).domain.smallend.vect[1];
  lVar25 = (((crse->super_BaseFab<double>).domain.bigend.vect[1] - iVar18) + 1) * lVar21;
  iVar4 = (crse->super_BaseFab<double>).domain.smallend.vect[2];
  lVar14 = (((crse->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1) * lVar25;
  lVar15 = crse_comp * lVar14;
  piVar10 = (solve_mask->super_BaseFab<int>).dptr;
  if (piVar10 == (int *)0x0) {
    local_144 = 1;
    local_98 = 0;
    local_148 = 1;
    local_14c = 1;
    local_90 = 0;
    local_88 = 0;
  }
  else {
    local_144 = (solve_mask->super_BaseFab<int>).domain.smallend.vect[0];
    local_148 = (solve_mask->super_BaseFab<int>).domain.smallend.vect[1];
    local_14c = (solve_mask->super_BaseFab<int>).domain.smallend.vect[2];
    local_88 = (long)(((solve_mask->super_BaseFab<int>).domain.bigend.vect[0] - local_144) + 1);
    local_90 = (((solve_mask->super_BaseFab<int>).domain.bigend.vect[1] - local_148) + 1) * local_88
    ;
    local_98 = (((solve_mask->super_BaseFab<int>).domain.bigend.vect[2] - local_14c) + 1) * local_90
    ;
  }
  pdVar35 = (crse->super_BaseFab<double>).dptr;
  uVar5 = (fine_region->btype).itype;
  if ((uVar5 & 1) == 0) {
    iVar6 = ratio->vect[0];
    iVar7 = ratio->vect[1];
    iVar8 = ratio->vect[2];
    local_1b4 = (fine_region->smallend).vect[1];
    local_1b8 = (fine_region->smallend).vect[2];
    if ((uVar5 & 2) == 0) {
      if (ncomp < 1) {
        return;
      }
      local_1b0 = (fine_region->bigend).vect[2];
      local_1ac = (fine_region->bigend).vect[1];
      local_19c = (fine_region->smallend).vect[0];
      iVar9 = (fine_region->bigend).vect[0];
      local_158 = 0;
      do {
        if ((int)local_1b8 <= (int)local_1b0) {
          uVar11 = local_1b8;
          do {
            if ((int)local_1b4 <= (int)local_1ac) {
              uVar12 = local_1b4;
              do {
                if ((int)local_19c <= iVar9) {
                  uVar31 = (long)(int)local_19c;
                  do {
                    uVar29 = uVar11;
                    if (((iVar8 != 1) && (uVar29 = (int)uVar11 >> 2, iVar8 != 4)) &&
                       (uVar29 = (int)uVar11 >> 1, iVar8 != 2)) {
                      if ((int)uVar11 < 0) {
                        uVar29 = ~((int)~uVar11 / iVar8);
                      }
                      else {
                        uVar29 = (int)uVar11 / iVar8;
                      }
                    }
                    if (uVar29 * iVar8 == uVar11) {
                      uVar16 = (uint)uVar31;
                      if (iVar6 != 1) {
                        if (iVar6 == 4) {
                          if ((long)uVar31 < 0) {
                            uVar16 = (int)uVar16 >> 2;
                          }
                          else {
                            uVar16 = uVar16 >> 2;
                          }
                        }
                        else if (iVar6 == 2) {
                          if ((long)uVar31 < 0) {
                            uVar16 = (int)uVar16 >> 1;
                          }
                          else {
                            uVar16 = uVar16 >> 1;
                          }
                        }
                        else if ((long)uVar31 < 0) {
                          uVar16 = ~((int)~uVar16 / iVar6);
                        }
                        else {
                          uVar16 = (uint)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 |
                                                uVar31 & 0xffffffff) / (long)iVar6);
                        }
                      }
                      uVar36 = uVar12;
                      if (((iVar7 != 1) && (uVar36 = (int)uVar12 >> 2, iVar7 != 4)) &&
                         (uVar36 = (int)uVar12 >> 1, iVar7 != 2)) {
                        if ((int)uVar12 < 0) {
                          uVar36 = ~((int)~uVar12 / iVar7);
                        }
                        else {
                          uVar36 = (int)uVar12 / iVar7;
                        }
                      }
                      if ((piVar10 == (int *)0x0) ||
                         (piVar10[(int)(uVar36 - local_148) * local_88 +
                                  (long)(int)(uVar16 - local_144) +
                                  (int)(uVar29 - local_14c) * local_90 + local_158 * local_98] != 0)
                         ) {
                        pdVar28[lVar26 + local_158 * lVar20 +
                                         (int)(uVar11 - iVar3) * lVar23 +
                                         (int)(uVar12 - iVar2) * lVar30 + (uVar31 - lVar17)] =
                             pdVar35[lVar15 + (int)(uVar36 - iVar18) * lVar21 +
                                              (long)(int)(uVar16 - iVar19) +
                                              (int)(uVar29 - iVar4) * lVar25 + local_158 * lVar14];
                      }
                    }
                    uVar31 = uVar31 + 1;
                  } while ((int)uVar31 != iVar9 + 1);
                }
                bVar37 = uVar12 != local_1ac;
                uVar12 = uVar12 + 1;
              } while (bVar37);
            }
            bVar37 = uVar11 != local_1b0;
            uVar11 = uVar11 + 1;
          } while (bVar37);
        }
        local_158 = local_158 + 1;
      } while (local_158 != (uint)ncomp);
    }
    else {
      if (ncomp < 1) {
        return;
      }
      local_1b0 = (fine_region->bigend).vect[2];
      local_1ac = (fine_region->bigend).vect[1];
      local_19c = (fine_region->smallend).vect[0];
      iVar9 = (fine_region->bigend).vect[0];
      local_158 = 0;
      do {
        if ((int)local_1b8 <= (int)local_1b0) {
          uVar11 = local_1b8;
          do {
            if ((int)local_1b4 <= (int)local_1ac) {
              uVar12 = local_1b4;
              do {
                if ((int)local_19c <= iVar9) {
                  uVar31 = (long)(int)local_19c;
                  do {
                    uVar29 = uVar12;
                    if (((iVar7 != 1) && (uVar29 = (int)uVar12 >> 2, iVar7 != 4)) &&
                       (uVar29 = (int)uVar12 >> 1, iVar7 != 2)) {
                      if ((int)uVar12 < 0) {
                        uVar29 = ~((int)~uVar12 / iVar7);
                      }
                      else {
                        uVar29 = (int)uVar12 / iVar7;
                      }
                    }
                    if (uVar29 * iVar7 == uVar12) {
                      uVar16 = (uint)uVar31;
                      if (iVar6 != 1) {
                        if (iVar6 == 4) {
                          if ((long)uVar31 < 0) {
                            uVar16 = (int)uVar16 >> 2;
                          }
                          else {
                            uVar16 = uVar16 >> 2;
                          }
                        }
                        else if (iVar6 == 2) {
                          if ((long)uVar31 < 0) {
                            uVar16 = (int)uVar16 >> 1;
                          }
                          else {
                            uVar16 = uVar16 >> 1;
                          }
                        }
                        else if ((long)uVar31 < 0) {
                          uVar16 = ~((int)~uVar16 / iVar6);
                        }
                        else {
                          uVar16 = (uint)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 |
                                                uVar31 & 0xffffffff) / (long)iVar6);
                        }
                      }
                      uVar36 = uVar11;
                      if (((iVar8 != 1) && (uVar36 = (int)uVar11 >> 2, iVar8 != 4)) &&
                         (uVar36 = (int)uVar11 >> 1, iVar8 != 2)) {
                        if ((int)uVar11 < 0) {
                          uVar36 = ~((int)~uVar11 / iVar8);
                        }
                        else {
                          uVar36 = (int)uVar11 / iVar8;
                        }
                      }
                      if ((piVar10 == (int *)0x0) ||
                         (piVar10[(int)(uVar29 - local_148) * local_88 +
                                  (long)(int)(uVar16 - local_144) +
                                  (int)(uVar36 - local_14c) * local_90 + local_158 * local_98] != 0)
                         ) {
                        pdVar28[lVar26 + local_158 * lVar20 +
                                         (int)(uVar11 - iVar3) * lVar23 +
                                         (int)(uVar12 - iVar2) * lVar30 + (uVar31 - lVar17)] =
                             pdVar35[lVar15 + (int)(uVar29 - iVar18) * lVar21 +
                                              (long)(int)(uVar16 - iVar19) +
                                              (int)(uVar36 - iVar4) * lVar25 + local_158 * lVar14];
                      }
                    }
                    uVar31 = uVar31 + 1;
                  } while ((int)uVar31 != iVar9 + 1);
                }
                bVar37 = uVar12 != local_1ac;
                uVar12 = uVar12 + 1;
              } while (bVar37);
            }
            bVar37 = uVar11 != local_1b0;
            uVar11 = uVar11 + 1;
          } while (bVar37);
        }
        local_158 = local_158 + 1;
      } while (local_158 != (uint)ncomp);
    }
  }
  else {
    if (ncomp < 1) {
      return;
    }
    iVar6 = ratio->vect[0];
    iVar7 = ratio->vect[1];
    iVar8 = ratio->vect[2];
    local_1b4 = (fine_region->smallend).vect[1];
    local_1b8 = (fine_region->smallend).vect[2];
    local_1b0 = (fine_region->bigend).vect[2];
    local_1ac = (fine_region->bigend).vect[1];
    local_19c = (fine_region->smallend).vect[0];
    iVar9 = (fine_region->bigend).vect[0];
    local_f8 = pdVar28 + ((lVar26 + (int)local_19c) - lVar17);
    local_68 = 0;
    do {
      if ((int)local_1b8 <= (int)local_1b0) {
        uVar11 = local_1b8;
        do {
          if ((int)local_1b4 <= (int)local_1ac) {
            uVar12 = local_1b4;
            do {
              if ((int)local_19c <= iVar9) {
                pdVar27 = (double *)
                          ((((int)uVar11 - lVar32) * lVar22 * 8 + lVar34 * -8 +
                           (long)(int)uVar12 * 8) * lVar30 + (long)local_f8);
                uVar31 = (long)(int)local_19c;
                uVar29 = ~local_19c;
                do {
                  uVar16 = (uint)uVar31;
                  if (iVar6 == 4) {
                    if ((long)uVar31 < 0) {
                      uVar36 = (int)uVar16 >> 2;
                    }
                    else {
                      uVar36 = uVar16 >> 2;
                    }
                  }
                  else if (iVar6 == 2) {
                    if ((long)uVar31 < 0) {
                      uVar36 = (int)uVar16 >> 1;
                    }
                    else {
                      uVar36 = uVar16 >> 1;
                    }
                  }
                  else {
                    uVar36 = uVar16;
                    if (iVar6 != 1) {
                      if ((long)uVar31 < 0) {
                        uVar36 = ~((int)uVar29 / iVar6);
                      }
                      else {
                        uVar36 = (uint)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 |
                                              uVar31 & 0xffffffff) / (long)iVar6);
                      }
                    }
                  }
                  if (uVar16 == uVar36 * iVar6) {
                    uVar16 = uVar12;
                    if (((iVar7 != 1) && (uVar16 = (int)uVar12 >> 2, iVar7 != 4)) &&
                       (uVar16 = (int)uVar12 >> 1, iVar7 != 2)) {
                      if ((int)uVar12 < 0) {
                        uVar16 = ~((int)~uVar12 / iVar7);
                      }
                      else {
                        uVar16 = (int)uVar12 / iVar7;
                      }
                    }
                    uVar33 = uVar11;
                    if (((iVar8 != 1) && (uVar33 = (int)uVar11 >> 2, iVar8 != 4)) &&
                       (uVar33 = (int)uVar11 >> 1, iVar8 != 2)) {
                      if ((int)uVar11 < 0) {
                        uVar33 = ~((int)~uVar11 / iVar8);
                      }
                      else {
                        uVar33 = (int)uVar11 / iVar8;
                      }
                    }
                    if ((piVar10 == (int *)0x0) ||
                       (piVar10[(int)(uVar16 - local_148) * local_88 +
                                (long)(int)(uVar36 - local_144) +
                                (int)(uVar33 - local_14c) * local_90 + local_68 * local_98] != 0)) {
                      *pdVar27 = pdVar35[lVar15 + (int)(uVar16 - iVar18) * lVar21 +
                                                  (long)(int)(uVar36 - iVar19) +
                                                  (int)(uVar33 - iVar4) * lVar25 + local_68 * lVar14
                                        ];
                    }
                  }
                  uVar31 = uVar31 + 1;
                  pdVar27 = pdVar27 + 1;
                  uVar29 = uVar29 - 1;
                } while (iVar9 + 1 != (int)uVar31);
              }
              bVar37 = uVar12 != local_1ac;
              uVar12 = uVar12 + 1;
            } while (bVar37);
          }
          bVar37 = uVar11 != local_1b0;
          uVar11 = uVar11 + 1;
        } while (bVar37);
      }
      local_68 = local_68 + 1;
      local_f8 = local_f8 + lVar20;
    } while (local_68 != (uint)ncomp);
  }
  if ((uVar5 & 1) == 0) {
    if ((uVar5 & 2) == 0) {
      if (0 < ncomp) {
        iVar1 = ratio->vect[2];
        uVar5 = (fine_region->bigend).vect[2];
        iVar2 = (fine_region->bigend).vect[0];
        uVar11 = (fine_region->bigend).vect[1];
        iVar19 = (fine_region->smallend).vect[0];
        local_190 = pdVar28 + (iVar19 - lVar17);
        uVar31 = 0;
        do {
          uVar12 = local_1b8;
          if ((int)local_1b8 <= (int)uVar5) {
            do {
              if ((int)local_1b4 <= (int)uVar11) {
                uVar29 = local_1b4;
                do {
                  if (iVar19 <= iVar2) {
                    lVar14 = (lVar24 * lVar13 * lVar22 * 8 + lVar34 * -8 + (long)(int)uVar29 * 8) *
                             lVar30;
                    lVar15 = 0;
                    do {
                      uVar16 = uVar12;
                      if (((iVar1 != 1) && (uVar16 = (int)uVar12 >> 2, iVar1 != 4)) &&
                         (uVar16 = (int)uVar12 >> 1, iVar1 != 2)) {
                        if ((int)uVar12 < 0) {
                          uVar16 = ~((int)~uVar12 / iVar1);
                        }
                        else {
                          uVar16 = (int)uVar12 / iVar1;
                        }
                      }
                      iVar18 = uVar12 - uVar16 * iVar1;
                      if (iVar18 != 0) {
                        dVar38 = (double)iVar18 * (1.0 / (double)iVar1);
                        *(double *)
                         ((long)local_190 +
                         lVar15 * 8 +
                         ((lVar24 * lVar13 * 8 + lVar32 * -8 + (long)(int)uVar12 * 8) * lVar22 +
                          lVar34 * -8 + (long)(int)uVar29 * 8) * lVar30) =
                             (1.0 - dVar38) *
                             *(double *)
                              ((long)local_190 +
                              lVar15 * 8 + (long)(int)(uVar16 * iVar1 - iVar3) * lVar23 * 8 + lVar14
                              ) + dVar38 * *(double *)
                                            ((long)local_190 +
                                            lVar15 * 8 +
                                            (long)(int)((uVar16 + 1) * iVar1 - iVar3) * lVar23 * 8 +
                                            lVar14);
                      }
                      lVar15 = lVar15 + 1;
                    } while ((iVar2 - iVar19) + 1 != (int)lVar15);
                  }
                  bVar37 = uVar29 != uVar11;
                  uVar29 = uVar29 + 1;
                } while (bVar37);
              }
              bVar37 = uVar12 != uVar5;
              uVar12 = uVar12 + 1;
            } while (bVar37);
          }
          uVar31 = uVar31 + 1;
          local_190 = local_190 + lVar20;
        } while (uVar31 != (uint)ncomp);
      }
    }
    else if (0 < ncomp) {
      iVar1 = ratio->vect[1];
      uVar5 = (fine_region->bigend).vect[2];
      iVar2 = (fine_region->bigend).vect[0];
      uVar11 = (fine_region->bigend).vect[1];
      iVar3 = (fine_region->smallend).vect[0];
      local_190 = pdVar28 + (iVar3 - lVar17);
      uVar31 = 0;
      do {
        uVar12 = local_1b8;
        if ((int)local_1b8 <= (int)uVar5) {
          do {
            if ((int)local_1b4 <= (int)uVar11) {
              lVar14 = (lVar24 * lVar13 * 8 + lVar32 * -8 + (long)(int)uVar12 * 8) * lVar22 +
                       lVar34 * -8;
              uVar29 = local_1b4;
              do {
                if (iVar3 <= iVar2) {
                  pdVar28 = local_190;
                  iVar19 = (iVar2 - iVar3) + 1;
                  do {
                    uVar16 = uVar29;
                    if (((iVar1 != 1) && (uVar16 = (int)uVar29 >> 2, iVar1 != 4)) &&
                       (uVar16 = (int)uVar29 >> 1, iVar1 != 2)) {
                      if ((int)uVar29 < 0) {
                        uVar16 = ~((int)~uVar29 / iVar1);
                      }
                      else {
                        uVar16 = (int)uVar29 / iVar1;
                      }
                    }
                    iVar18 = uVar29 - uVar16 * iVar1;
                    if (iVar18 != 0) {
                      dVar38 = (double)iVar18 * (1.0 / (double)iVar1);
                      *(double *)((long)pdVar28 + (lVar14 + (long)(int)uVar29 * 8) * lVar30) =
                           (1.0 - dVar38) *
                           *(double *)
                            ((long)pdVar28 + (lVar14 + (long)(int)(uVar16 * iVar1) * 8) * lVar30) +
                           dVar38 * *(double *)
                                     ((long)pdVar28 +
                                     (lVar14 + (long)(int)((uVar16 + 1) * iVar1) * 8) * lVar30);
                    }
                    pdVar28 = pdVar28 + 1;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                }
                bVar37 = uVar29 != uVar11;
                uVar29 = uVar29 + 1;
              } while (bVar37);
            }
            bVar37 = uVar12 != uVar5;
            uVar12 = uVar12 + 1;
          } while (bVar37);
        }
        uVar31 = uVar31 + 1;
        local_190 = local_190 + lVar20;
      } while (uVar31 != (uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    iVar19 = ratio->vect[0];
    local_190 = pdVar28 + ((lVar26 + (int)local_19c) - lVar17);
    local_180 = 0;
    do {
      if ((int)local_1b8 <= (int)local_1b0) {
        uVar5 = local_1b8;
        do {
          if ((int)local_1b4 <= (int)local_1ac) {
            lVar13 = (int)(uVar5 - iVar3) * lVar23;
            uVar11 = local_1b4;
            do {
              if ((int)local_19c <= iVar9) {
                pdVar35 = (double *)
                          ((((int)uVar5 - lVar32) * lVar22 * 8 + lVar34 * -8 + (long)(int)uVar11 * 8
                           ) * lVar30 + (long)local_190);
                lVar14 = (int)(uVar11 - iVar2) * lVar30;
                uVar31 = (long)(int)local_19c;
                uVar12 = ~local_19c;
                do {
                  uVar29 = (uint)uVar31;
                  if (iVar19 == 4) {
                    if ((long)uVar31 < 0) {
                      uVar16 = (int)uVar29 >> 2;
                    }
                    else {
                      uVar16 = uVar29 >> 2;
                    }
                  }
                  else if (iVar19 == 2) {
                    if ((long)uVar31 < 0) {
                      uVar16 = (int)uVar29 >> 1;
                    }
                    else {
                      uVar16 = uVar29 >> 1;
                    }
                  }
                  else {
                    uVar16 = uVar29;
                    if (iVar19 != 1) {
                      if ((long)uVar31 < 0) {
                        uVar16 = ~((int)uVar12 / iVar19);
                      }
                      else {
                        uVar16 = (uint)((long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 |
                                              uVar31 & 0xffffffff) / (long)iVar19);
                      }
                    }
                  }
                  if (uVar29 != uVar16 * iVar19) {
                    dVar38 = (double)(int)(-iVar19 * uVar16 + uVar29) * (1.0 / (double)iVar19);
                    *pdVar35 = (1.0 - dVar38) *
                               pdVar28[lVar26 + local_180 * lVar20 +
                                                lVar13 + lVar14 + (int)(uVar16 * iVar19 - iVar1)] +
                               dVar38 * pdVar28[lVar26 + local_180 * lVar20 +
                                                         lVar13 + lVar14 + (int)((uVar16 + 1) *
                                                                                 iVar19 - iVar1)];
                  }
                  uVar31 = uVar31 + 1;
                  pdVar35 = pdVar35 + 1;
                  uVar12 = uVar12 - 1;
                } while (iVar9 + 1 != (int)uVar31);
              }
              bVar37 = uVar11 != local_1ac;
              uVar11 = uVar11 + 1;
            } while (bVar37);
          }
          bVar37 = uVar5 != local_1b0;
          uVar5 = uVar5 + 1;
        } while (bVar37);
      }
      local_180 = local_180 + 1;
      local_190 = local_190 + lVar20;
    } while (local_180 != (uint)ncomp);
  }
  return;
}

Assistant:

void
FaceLinear::interp_face (const FArrayBox&  crse,
                         const int         crse_comp,
                         FArrayBox&        fine,
                         const int         fine_comp,
                         const int         ncomp,
                         const Box&        fine_region,
                         const IntVect&    ratio,
                         const IArrayBox&  solve_mask,
                         const Geometry& /*crse_geom */,
                         const Geometry& /*fine_geom */,
                         Vector<BCRec> const& /*bcr*/,
                         const int         /*bccomp*/,
                         RunOn             runon)
{
    BL_PROFILE("FaceLinear::interp_face()");

    AMREX_ASSERT(AMREX_D_TERM(fine_region.type(0),+fine_region.type(1),+fine_region.type(2)) == 1);

    Array4<Real> const& fine_arr = fine.array(fine_comp);
    Array4<Real const> const& crse_arr = crse.const_array(crse_comp);
    Array4<const int> mask_arr;
    if (solve_mask.isAllocated()) {
        mask_arr = solve_mask.const_array();
    }

    //
    // Fill fine ghost faces with piecewise-constant interpolation of coarse data.
    // Operate only on faces that overlap--ie, only fill the fine faces that make up each
    // coarse face, leave the in-between faces alone.
    // The mask ensures we do not overwrite valid fine cells.
    //
    if (fine_region.type(0) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_x(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM >= 2)
    else if (fine_region.type(1) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_y(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM == 3)
    else
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_z(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#endif
#endif

    //
    // Interpolate unfilled grow cells using best data from
    // surrounding faces of valid region, and pc-interpd data
    // on fine faces overlaying coarse edges.
    //
    if (fine_region.type(0) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_x(i,j,k,n,fine_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM >= 2)
    else if (fine_region.type(1) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_y(i,j,k,n,fine_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM == 3)
    else
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_z(i,j,k,n,fine_arr,ratio);
        });
    }
#endif
#endif
}